

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O0

void generateAsm<true>(uint32_t nonce)

{
  uint32_t in_EDI;
  Program p;
  AssemblyGeneratorX86 asmX86;
  uint8_t scratchpad [2097152];
  uint8_t blockTemplate [76];
  uint64_t hash [8];
  ostream *os;
  AssemblyGeneratorX86 *in_stack_ffffffffffdff530;
  Program *in_stack_ffffffffffdff588;
  AssemblyGeneratorX86 *in_stack_ffffffffffdff590;
  void *in_stack_ffffffffffdff5b8;
  size_t in_stack_ffffffffffdff5c0;
  void *in_stack_ffffffffffdff5c8;
  void *in_stack_ffffffffffdff5f8;
  size_t in_stack_ffffffffffdff600;
  void *in_stack_ffffffffffdff608;
  size_t in_stack_ffffffffffdff618;
  void *in_stack_ffffffffffdff620;
  size_t in_stack_ffffffffffdff628;
  void *in_stack_ffffffffffdff630;
  size_t in_stack_ffffffffffdff638;
  void *in_stack_ffffffffffdff640;
  uint8_t local_78 [48];
  ostream local_48 [72];
  
  local_78[0x20] = 0xee;
  local_78[0x21] = 0xf9;
  local_78[0x22] = '\\';
  local_78[0x23] = 0xd2;
  local_78[0x24] = '\f';
  local_78[0x25] = 0xef;
  local_78[0x26] = 0xc1;
  local_78[0x27] = '/';
  local_78[0x28] = 'a';
  local_78[0x29] = 0xd5;
  local_78[0x2a] = 'a';
  local_78[0x2b] = '\t';
  local_78[0x10] = 0xa5;
  local_78[0x11] = 0xb1;
  local_78[0x12] = 0xd4;
  local_78[0x13] = 0xce;
  local_78[0x14] = 'k';
  local_78[0x15] = 0xbf;
  local_78[0x16] = 0xdf;
  local_78[0x17] = '\n';
  local_78[0x18] = 0xca;
  local_78[0x19] = 0xc3;
  local_78[0x1a] = 0x8b;
  local_78[0x1b] = 0xde;
  local_78[0x1c] = 0xd3;
  local_78[0x1d] = 'M';
  local_78[0x1e] = '-';
  local_78[0x1f] = 0xcd;
  local_78[0] = 'O';
  local_78[1] = 0x85;
  local_78[2] = '?';
  local_78[3] = '\0';
  local_78[4] = '+';
  local_78[5] = '.';
  local_78[6] = 0xea;
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = 'w';
  local_78[0xc] = 0xb2;
  local_78[0xd] = '\x06';
  local_78[0xe] = 0xa0;
  local_78[0xf] = ',';
  store32(local_78 + 7,in_EDI);
  os = local_48;
  randomx_blake2b(in_stack_ffffffffffdff640,in_stack_ffffffffffdff638,in_stack_ffffffffffdff630,
                  in_stack_ffffffffffdff628,in_stack_ffffffffffdff620,in_stack_ffffffffffdff618);
  fillAes1Rx4<true>(in_stack_ffffffffffdff5c8,in_stack_ffffffffffdff5c0,in_stack_ffffffffffdff5b8);
  randomx::AssemblyGeneratorX86::AssemblyGeneratorX86((AssemblyGeneratorX86 *)0x1075ab);
  fillAes4Rx4<true>(in_stack_ffffffffffdff608,in_stack_ffffffffffdff600,in_stack_ffffffffffdff5f8);
  randomx::AssemblyGeneratorX86::generateProgram
            (in_stack_ffffffffffdff590,in_stack_ffffffffffdff588);
  randomx::AssemblyGeneratorX86::printCode(in_stack_ffffffffffdff530,os);
  randomx::AssemblyGeneratorX86::~AssemblyGeneratorX86((AssemblyGeneratorX86 *)0x1075f7);
  return;
}

Assistant:

void generateAsm(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[randomx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, randomx::ScratchpadSize, scratchpad);
	randomx::AssemblyGeneratorX86 asmX86;
	randomx::Program p;
	fillAes4Rx4<softAes>(hash, sizeof(p), &p);
	asmX86.generateProgram(p);
	asmX86.printCode(std::cout);
}